

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_writeSkippableFrame
                 (void *dst,size_t dstCapacity,void *src,size_t srcSize,uint magicVariant)

{
  undefined8 uStack_10;
  
  uStack_10 = srcSize + 8;
  if (dstCapacity < uStack_10) {
    uStack_10 = 0xffffffffffffffba;
  }
  else if (srcSize >> 0x20 == 0) {
    if (magicVariant < 0x10) {
      *(uint *)dst = magicVariant | 0x184d2a50;
      *(int *)((long)dst + 4) = (int)srcSize;
      switchD_0193dc74::default((void *)((long)dst + 8),src,srcSize);
    }
    else {
      uStack_10 = 0xffffffffffffffd6;
    }
  }
  else {
    uStack_10 = 0xffffffffffffffb8;
  }
  return uStack_10;
}

Assistant:

size_t ZSTD_writeSkippableFrame(void* dst, size_t dstCapacity,
                                const void* src, size_t srcSize, unsigned magicVariant) {
    BYTE* op = (BYTE*)dst;
    RETURN_ERROR_IF(dstCapacity < srcSize + ZSTD_SKIPPABLEHEADERSIZE /* Skippable frame overhead */,
                    dstSize_tooSmall, "Not enough room for skippable frame");
    RETURN_ERROR_IF(srcSize > (unsigned)0xFFFFFFFF, srcSize_wrong, "Src size too large for skippable frame");
    RETURN_ERROR_IF(magicVariant > 15, parameter_outOfBound, "Skippable frame magic number variant not supported");

    MEM_writeLE32(op, (U32)(ZSTD_MAGIC_SKIPPABLE_START + magicVariant));
    MEM_writeLE32(op+4, (U32)srcSize);
    ZSTD_memcpy(op+8, src, srcSize);
    return srcSize + ZSTD_SKIPPABLEHEADERSIZE;
}